

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::Model::AddBody
          (Model *this,uint parent_id,SpatialTransform *joint_frame,Joint *joint,Body *body,
          string *body_name)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  value_type vVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference ppCVar8;
  long lVar9;
  undefined8 uVar10;
  mapped_type *pmVar11;
  SpatialTransform *XT;
  double *v5;
  double *pdVar12;
  reference pvVar13;
  double *v3;
  double *v2;
  double *v1;
  double *v0;
  ostream *poVar14;
  RBDLError *this_00;
  const_iterator __position;
  pair<RigidBodyDynamics::JointType,_unsigned_int> *ppVar15;
  reference pvVar16;
  pointer ppVar17;
  value_type_conflict *__x;
  long in_RCX;
  uint in_ESI;
  long in_RDI;
  string *in_R9;
  iterator type_iter;
  JointType current_joint_type;
  uint i_2;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  joint_types;
  ostringstream errormsg_1;
  SpatialRigidBodyInertia rbi;
  uint i_1;
  int mCustomJoint_joint_counter;
  int multdof3_joint_counter;
  uint prev_joint_index;
  ostringstream errormsg;
  uint i;
  uint custom_index;
  uint lambda_q_last;
  uint fbody_id;
  SpatialTransform movable_parent_transform;
  uint movable_parent_id;
  SpatialTransform *in_stack_fffffffffffff0a8;
  value_type *pvVar18;
  value_type *pvVar19;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  *other;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *other_00;
  value_type *__x_00;
  iterator in_stack_fffffffffffff0b0;
  value_type *in_stack_fffffffffffff0b8;
  vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
  *in_stack_fffffffffffff0c0;
  Model *in_stack_fffffffffffff0c8;
  SpatialTransform *in_stack_fffffffffffff0d0;
  key_type *in_stack_fffffffffffff0e8;
  ostringstream *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffff0f0;
  double *in_stack_fffffffffffff108;
  double *in_stack_fffffffffffff110;
  double *in_stack_fffffffffffff118;
  double *in_stack_fffffffffffff120;
  double *in_stack_fffffffffffff128;
  SpatialVector_t *in_stack_fffffffffffff130;
  double *in_stack_fffffffffffff140;
  undefined4 in_stack_fffffffffffff178;
  uint in_stack_fffffffffffff17c;
  Matrix3d *in_stack_fffffffffffff228;
  undefined4 in_stack_fffffffffffff230;
  uint in_stack_fffffffffffff234;
  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
  *in_stack_fffffffffffff238;
  __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
  local_d30;
  JointType local_d24;
  JointType local_d20;
  pair<RigidBodyDynamics::JointType,_unsigned_int> local_d1c;
  uint local_d14;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  local_d10;
  undefined1 local_cf1;
  ostringstream local_cd0 [376];
  value_type local_b58;
  undefined8 local_b50;
  undefined8 local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined8 local_b30;
  value_type local_af8 [3];
  value_type local_a48 [3];
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined8 local_9a8;
  undefined8 local_9a0;
  undefined8 local_998;
  undefined8 local_990;
  value_type local_958 [2];
  string *in_stack_fffffffffffff710;
  Body *in_stack_fffffffffffff718;
  Joint *in_stack_fffffffffffff720;
  SpatialTransform *in_stack_fffffffffffff728;
  uint in_stack_fffffffffffff734;
  Model *in_stack_fffffffffffff738;
  string *in_stack_fffffffffffff808;
  Body *in_stack_fffffffffffff810;
  Joint *in_stack_fffffffffffff818;
  SpatialTransform *in_stack_fffffffffffff820;
  uint in_stack_fffffffffffff82c;
  Model *in_stack_fffffffffffff830;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  uint local_708;
  undefined4 local_704;
  int local_700;
  undefined4 local_6fc;
  value_type local_538 [2];
  uint local_46c;
  value_type local_468;
  value_type local_408 [2];
  undefined1 local_399;
  ostringstream local_378 [376];
  _Self local_200;
  _Self local_1f8 [25];
  undefined4 local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  int local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_8c;
  string local_88 [48];
  string local_58 [48];
  long local_28;
  uint local_14;
  uint local_4;
  
  if (*(int *)(in_RCX + 8) == 0xc) {
    std::__cxx11::string::string(local_58,in_R9);
    uVar3 = AddBodyFixedJoint(in_stack_fffffffffffff830,in_stack_fffffffffffff82c,
                              in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                              in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    *(uint *)(in_RDI + 0x54) = uVar3;
    std::__cxx11::string::~string(local_58);
    return *(uint *)(in_RDI + 0x54);
  }
  if (((((*(int *)(in_RCX + 8) != 6) && (*(int *)(in_RCX + 8) != 7)) && (*(int *)(in_RCX + 8) != 8))
      && ((((*(int *)(in_RCX + 8) != 9 && (*(int *)(in_RCX + 8) != 10)) &&
           ((*(int *)(in_RCX + 8) != 0x14 &&
            ((*(int *)(in_RCX + 8) != 2 && (*(int *)(in_RCX + 8) != 1)))))) &&
          (*(int *)(in_RCX + 8) != 3)))) &&
     (((*(int *)(in_RCX + 8) != 4 && (*(int *)(in_RCX + 8) != 5)) && (*(int *)(in_RCX + 8) != 0xd)))
     ) {
    std::__cxx11::string::string(local_88,in_R9);
    uVar3 = AddBodyMultiDofJoint
                      (in_stack_fffffffffffff738,in_stack_fffffffffffff734,in_stack_fffffffffffff728
                       ,in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                       in_stack_fffffffffffff710);
    *(uint *)(in_RDI + 0x54) = uVar3;
    std::__cxx11::string::~string(local_88);
    return *(uint *)(in_RDI + 0x54);
  }
  local_8c = in_ESI;
  local_28 = in_RCX;
  local_14 = in_ESI;
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff0d0);
  bVar2 = IsFixedBodyId(in_stack_fffffffffffff0c8,(uint)((ulong)in_stack_fffffffffffff0c0 >> 0x20));
  if (bVar2) {
    local_f4 = local_14 - *(int *)(in_RDI + 0x330);
    pvVar5 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RDI + 0x318),(ulong)local_f4);
    local_8c = pvVar5->mMovableParent;
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(in_RDI + 0x318),(ulong)local_f4);
    Math::SpatialTransform::operator=
              ((SpatialTransform *)in_stack_fffffffffffff0b0._M_current,in_stack_fffffffffffff0a8);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff0c0,
             (value_type_conflict *)in_stack_fffffffffffff0b8);
  sVar6 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  pvVar7 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),sVar6 - 1);
  local_f8 = pvVar7->q_index;
  sVar6 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  pvVar7 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),sVar6 - 1);
  if (pvVar7->mDoFCount != 0) {
    in_stack_fffffffffffff238 =
         (vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_> *)
         (in_RDI + 0xa0);
    sVar6 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[](in_stack_fffffffffffff238,sVar6 - 1);
    if (pvVar7->mJointType != JointTypeCustom) {
      in_stack_fffffffffffff228 = (Matrix3d *)(in_RDI + 0xa0);
      in_stack_fffffffffffff234 = local_f8;
      sVar6 = std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      *)(in_RDI + 0xa0));
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)in_stack_fffffffffffff228,sVar6 - 1);
      local_f8 = in_stack_fffffffffffff234 + pvVar7->mDoFCount;
      goto LAB_00844702;
    }
  }
  sVar6 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  pvVar7 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),sVar6 - 1);
  if (pvVar7->mJointType == JointTypeCustom) {
    sVar6 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar6 - 1);
    uVar3 = local_f8;
    local_fc = pvVar7->custom_joint_index;
    sVar6 = std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::size((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    *)(in_RDI + 0x1d8));
    ppCVar8 = std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                            *)(in_RDI + 0x1d8),sVar6 - 1);
    local_f8 = uVar3 + *(int *)(*ppCVar8 + 8);
  }
LAB_00844702:
  for (local_100 = 0; local_100 < *(uint *)(local_28 + 0xc); local_100 = local_100 + 1) {
    local_104 = local_f8 + local_100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffff0b0._M_current,(value_type_conflict *)in_stack_fffffffffffff0a8
              );
  }
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8447a2);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_fffffffffffff0b0._M_current,(value_type *)in_stack_fffffffffffff0a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff0c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        *)in_stack_fffffffffffff0b0._M_current,(size_type)in_stack_fffffffffffff0a8);
  sVar6 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 0x338));
  local_12c = (undefined4)sVar6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type_conflict *)in_stack_fffffffffffff0a8);
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff0d0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff0b0._M_current,in_stack_fffffffffffff0a8);
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff0d0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff0b0._M_current,in_stack_fffffffffffff0a8);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  push_back(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
  lVar9 = std::__cxx11::string::size();
  if (lVar9 != 0) {
    local_1f8[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)in_stack_fffffffffffff0a8,(key_type *)0x8448d7);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)in_stack_fffffffffffff0a8);
    bVar2 = std::operator!=(local_1f8,&local_200);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_378);
      poVar14 = std::operator<<((ostream *)local_378,"Error: Body with name \'");
      poVar14 = std::operator<<(poVar14,in_R9);
      poVar14 = std::operator<<(poVar14,"\' already exists!");
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
      local_399 = 1;
      uVar10 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      Errors::RBDLError::RBDLError
                ((RBDLError *)in_stack_fffffffffffff0d0,(string *)in_stack_fffffffffffff0c8);
      local_399 = 0;
      __cxa_throw(uVar10,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    sVar6 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 0x338));
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::operator[](in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
    *pmVar11 = (int)sVar6 - 1;
  }
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar18 = local_408;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120,
             in_stack_fffffffffffff118,in_stack_fffffffffffff110,in_stack_fffffffffffff108,
             in_stack_fffffffffffff140);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,pvVar18);
  local_468.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_468.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 0.0;
  local_468.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  local_468.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = 0.0;
  local_468.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = 0.0;
  local_468.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = 0.0;
  pvVar19 = &local_468;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120,
             in_stack_fffffffffffff118,in_stack_fffffffffffff110,in_stack_fffffffffffff108,
             in_stack_fffffffffffff140);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type *)pvVar19);
  sVar6 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  local_46c = (int)sVar6 - 1;
  std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
  push_back((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_> *
            )in_stack_fffffffffffff0c0,(value_type *)in_stack_fffffffffffff0b8);
  pvVar7 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),(ulong)local_46c);
  if (pvVar7->mJointType == JointTypeCustom) {
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    in_stack_fffffffffffff17c = pvVar7->q_index;
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    uVar3 = in_stack_fffffffffffff17c + pvVar7->mDoFCount;
    sVar6 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar6 - 1);
    pvVar7->q_index = uVar3;
  }
  else {
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    uVar3 = pvVar7->q_index;
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    uVar1 = pvVar7->mDoFCount;
    sVar6 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar6 - 1);
    pvVar7->q_index = uVar3 + uVar1;
  }
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0c0,(value_type *)in_stack_fffffffffffff0b8);
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff0d0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff0b0._M_current,pvVar19);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0c0,(value_type *)in_stack_fffffffffffff0b8);
  local_538[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[5] = 0.0;
  local_538[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] = 0.0;
  local_538[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] = 0.0;
  local_538[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] = 0.0;
  local_538[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] = 0.0;
  local_538[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] = 0.0;
  pvVar19 = local_538;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120,
             in_stack_fffffffffffff118,in_stack_fffffffffffff110,in_stack_fffffffffffff108,
             in_stack_fffffffffffff140);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type *)pvVar19);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero();
  Eigen::Matrix<double,6,3,0,6,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff0b0._M_current,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)pvVar19);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               *)in_stack_fffffffffffff0b0._M_current,(value_type *)pvVar19);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero();
  Eigen::Matrix<double,6,3,0,6,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff0b0._M_current,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)pvVar19);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               *)in_stack_fffffffffffff0b0._M_current,(value_type *)pvVar19);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffff0b0._M_current,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)pvVar19);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back
            ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)in_stack_fffffffffffff0b0._M_current,
             &pvVar19->E);
  XT = (SpatialTransform *)(in_RDI + 0x1a8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_fffffffffffff0b0._M_current,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)pvVar19);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffff0b0._M_current,
             (value_type *)pvVar19);
  local_6fc = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type_conflict *)pvVar19);
  *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + *(int *)(local_28 + 0xc);
  local_700 = 0;
  local_704 = 0;
  local_708 = 1;
  while( true ) {
    v5 = (double *)(ulong)local_708;
    pdVar12 = (double *)
              std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      *)(in_RDI + 0xa0));
    if (pdVar12 <= v5) break;
    pvVar7 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_708);
    if (pvVar7->mJointType == JointTypeSpherical) {
      vVar4 = *(int *)(in_RDI + 0x48) + local_700;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1c0),
                           (ulong)local_708);
      *pvVar13 = vVar4;
      local_700 = local_700 + 1;
    }
    local_708 = local_708 + 1;
  }
  *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x48) + local_700;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + *(int *)(local_28 + 0xc);
  Math::SpatialTransform::operator*
            ((SpatialTransform *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),XT);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff0b0._M_current,pvVar19);
  local_7a0 = 0;
  local_7a8 = 0;
  local_7b0 = 0;
  local_7b8 = 0;
  local_7c0 = 0;
  local_7c8 = 0;
  other = (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
           *)&local_7c8;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120,
             in_stack_fffffffffffff118,in_stack_fffffffffffff110,in_stack_fffffffffffff108,v5);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type *)other);
  pdVar12 = (double *)(in_RDI + 0x208);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Zero();
  SpatialMatrix_t::
  SpatialMatrix_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            ((SpatialMatrix_t *)in_stack_fffffffffffff0b0._M_current,other);
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::push_back
            ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type *)other);
  v3 = (double *)(in_RDI + 0x220);
  local_958[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_958[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_958[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_958[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_958[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_958[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar18 = local_958;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120,
             in_stack_fffffffffffff118,v3,pdVar12,v5);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,pvVar18);
  v2 = (double *)(in_RDI + 0x238);
  local_990 = 0;
  local_998 = 0;
  local_9a0 = 0;
  local_9a8 = 0;
  local_9b0 = 0;
  local_9b8 = 0;
  other_00 = (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_9b8;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128,in_stack_fffffffffffff120,v2,v3,
             pdVar12,v5);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type *)other_00);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (in_RDI + 0x338));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffff0b8);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff0b0._M_current,other_00);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (in_RDI + 0x338));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffff0b8);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff0b0._M_current,other_00);
  v1 = (double *)(in_RDI + 0x270);
  local_a48[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_a48[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_a48[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_a48[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_a48[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_a48[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar18 = local_a48;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128,v1,v2,v3,pdVar12,v5);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,pvVar18);
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            ((Scalar)in_stack_fffffffffffff238,
             (Vector3d *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               *)in_stack_fffffffffffff0c0,(value_type *)in_stack_fffffffffffff0b8);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               *)in_stack_fffffffffffff0c0,(value_type *)in_stack_fffffffffffff0b8);
  v0 = (double *)(in_RDI + 0x2b8);
  local_af8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_af8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_af8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_af8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_af8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_af8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar18 = local_af8;
  SpatialVector_t::SpatialVector_t(in_stack_fffffffffffff130,v0,v1,v2,v3,pdVar12,v5);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,pvVar18);
  local_b30 = 0;
  local_b38 = 0;
  local_b40 = 0;
  local_b48 = 0;
  local_b50 = 0;
  local_b58.first = JointTypeUndefined;
  local_b58.second = 0;
  __x_00 = &local_b58;
  SpatialVector_t::SpatialVector_t((SpatialVector_t *)(in_RDI + 0x2d0),v0,v1,v2,v3,pdVar12,v5);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff0b0._M_current,(value_type *)__x_00);
  sVar6 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 0x338));
  if (sVar6 != *(uint *)(in_RDI + 0x330)) {
    sVar6 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 0x338));
    *(int *)(in_RDI + 0x54) = (int)sVar6 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8458cb);
    std::
    vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ::vector((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
              *)0x8458d8);
    local_d14 = 0;
    while( true ) {
      __position._M_current = (pair<RigidBodyDynamics::JointType,_unsigned_int> *)(ulong)local_d14;
      ppVar15 = (pair<RigidBodyDynamics::JointType,_unsigned_int> *)
                std::
                vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                        *)(in_RDI + 0xa0));
      if (ppVar15 <= __position._M_current) break;
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),(ulong)local_d14);
      std::pair<RigidBodyDynamics::JointType,_unsigned_int>::
      pair<RigidBodyDynamics::JointType_&,_unsigned_int_&,_true>
                (&local_d1c,&pvVar7->mJointType,&local_d14);
      std::
      vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ::push_back((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   *)in_stack_fffffffffffff0b0._M_current,__x_00);
      in_stack_fffffffffffff0c0 =
           (vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
           (in_RDI + 0x118);
      pvVar7 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),(ulong)local_d14);
      local_d20 = pvVar7->mJointType;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffff0b0._M_current,&__x_00->first);
      local_d14 = local_d14 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x845a01);
    local_d24 = JointTypeUndefined;
    while (sVar6 = std::
                   vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   ::size(&local_d10), sVar6 != 0) {
      pvVar16 = std::
                vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                ::operator[](&local_d10,0);
      local_d24 = pvVar16->first;
      local_d30._M_current =
           (pair<RigidBodyDynamics::JointType,_unsigned_int> *)
           std::
           vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
           ::begin((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                    *)__x_00);
      while( true ) {
        std::
        vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ::end((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               *)__x_00);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                            *)in_stack_fffffffffffff0b0._M_current,
                           (__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                            *)__x_00);
        if (!bVar2) break;
        ppVar17 = __gnu_cxx::
                  __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                  ::operator->(&local_d30);
        if (ppVar17->first == local_d24) {
          __x = (value_type_conflict *)(in_RDI + 0x118);
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
          ::operator->(&local_d30);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff0c0,__x);
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,unsigned_int>const*,std::vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>>
          ::__normal_iterator<std::pair<RigidBodyDynamics::JointType,unsigned_int>*>
                    ((__normal_iterator<const_std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                      *)in_stack_fffffffffffff0b0._M_current,
                     (__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                      *)__x_00);
          in_stack_fffffffffffff0b0 =
               std::
               vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               ::erase((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                        *)in_stack_fffffffffffff0c0,__position);
          local_d30._M_current = in_stack_fffffffffffff0b0._M_current;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
          ::operator++(&local_d30);
        }
      }
    }
    local_4 = *(uint *)(in_RDI + 0x54);
    std::
    vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ::~vector((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               *)in_stack_fffffffffffff0c0);
    return local_4;
  }
  this_01 = local_cd0;
  std::__cxx11::ostringstream::ostringstream(this_01);
  poVar14 = std::operator<<((ostream *)this_01,"Error: cannot add more than ");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,*(uint *)(in_RDI + 0x330));
  poVar14 = std::operator<<(poVar14,
                            " movable bodies. You need to modify Model::fixed_body_discriminator for this."
                           );
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  local_cf1 = 1;
  this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  Errors::RBDLError::RBDLError(this_00,(string *)in_stack_fffffffffffff0c8);
  local_cf1 = 0;
  __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int Model::AddBody(
  const unsigned int parent_id,
  const SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  assert (lambda.size() > 0);
  assert (joint.mJointType != JointTypeUndefined);

  if (joint.mJointType == JointTypeFixed) {
    previously_added_body_id = AddBodyFixedJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);

    return previously_added_body_id;
  } else if ( (joint.mJointType == JointTypeSpherical)
              || (joint.mJointType == JointTypeEulerZYX)
              || (joint.mJointType == JointTypeEulerXYZ)
              || (joint.mJointType == JointTypeEulerYXZ)
              || (joint.mJointType == JointTypeTranslationXYZ)
              || (joint.mJointType == JointTypeCustom)
            ) {
    // no action required
  } else if (joint.mJointType != JointTypePrismatic
             && joint.mJointType != JointTypeRevolute
             && joint.mJointType != JointTypeRevoluteX
             && joint.mJointType != JointTypeRevoluteY
             && joint.mJointType != JointTypeRevoluteZ
             && joint.mJointType != JointTypeHelical
            ) {
    previously_added_body_id = AddBodyMultiDofJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);
    return previously_added_body_id;
  }

  // If we add the body to a fixed body we have to make sure that we
  // actually add it to its movable parent.
  unsigned int movable_parent_id = parent_id;
  SpatialTransform movable_parent_transform;

  if (IsFixedBodyId(parent_id)) {
    unsigned int fbody_id = parent_id - fixed_body_discriminator;
    movable_parent_id = mFixedBodies[fbody_id].mMovableParent;
    movable_parent_transform = mFixedBodies[fbody_id].mParentTransform;
  }

  // structural information
  lambda.push_back(movable_parent_id);
  unsigned int lambda_q_last = mJoints[mJoints.size() - 1].q_index;

  if (mJoints[mJoints.size() - 1].mDoFCount > 0
      && mJoints[mJoints.size() - 1].mJointType != JointTypeCustom) {
    lambda_q_last = lambda_q_last + mJoints[mJoints.size() - 1].mDoFCount;
  } else if (mJoints[mJoints.size() - 1].mJointType == JointTypeCustom) {
    unsigned int custom_index = mJoints[mJoints.size() - 1].custom_joint_index;
    lambda_q_last = lambda_q_last
                    + mCustomJoints[mCustomJoints.size() - 1]->mDoFCount;
  }

  for (unsigned int i = 0; i < joint.mDoFCount; i++) {
    lambda_q.push_back(lambda_q_last + i);
  }
  mu.push_back(std::vector<unsigned int>());
  mu.at(movable_parent_id).push_back(mBodies.size());

  // Bodies
  X_lambda.push_back(SpatialTransform());
  X_base.push_back(SpatialTransform());
  mBodies.push_back(body);

  if (body_name.size() != 0) {
    if (mBodyNameMap.find(body_name) != mBodyNameMap.end()) {
      std::ostringstream errormsg;
      errormsg << "Error: Body with name '"
               << body_name
               << "' already exists!"
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
    mBodyNameMap[body_name] = mBodies.size() - 1;
  }

  // state information
  v.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  a.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  // Joints
  unsigned int prev_joint_index = mJoints.size() - 1;
  mJoints.push_back(joint);

  if (mJoints[prev_joint_index].mJointType != JointTypeCustom) {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  } else {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  }

  S.push_back (joint.mJointAxes[0]);

  // Joint state variables
  X_J.push_back (SpatialTransform());
  v_J.push_back (joint.mJointAxes[0]);
  c_J.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  // workspace for joints with 3 dof
  multdof3_S.push_back (Matrix63::Zero());
  multdof3_U.push_back (Matrix63::Zero());
  multdof3_Dinv.push_back (Matrix3d::Zero());
  multdof3_u.push_back (Vector3d::Zero());
  multdof3_w_index.push_back (0);

  dof_count = dof_count + joint.mDoFCount;

  // update the w components of the Quaternions. They are stored at the end
  // of the q vector
  int multdof3_joint_counter = 0;
  int mCustomJoint_joint_counter = 0;
  for (unsigned int i = 1; i < mJoints.size(); i++) {
    if (mJoints[i].mJointType == JointTypeSpherical) {
      multdof3_w_index[i] = dof_count + multdof3_joint_counter;
      multdof3_joint_counter++;
    }
  }

  q_size = dof_count
           + multdof3_joint_counter;

  qdot_size = qdot_size + joint.mDoFCount;

  // we have to invert the transformation as it is later always used from the
  // child bodies perspective.
  X_T.push_back(joint_frame * movable_parent_transform);

  // Dynamic variables
  c.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  IA.push_back(SpatialMatrix::Zero());
  pA.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  U.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  d = VectorNd::Zero (mBodies.size());
  u = VectorNd::Zero (mBodies.size());

  f.push_back (SpatialVector (0., 0., 0., 0., 0., 0.));

  SpatialRigidBodyInertia rbi =
    SpatialRigidBodyInertia::createFromMassComInertiaC (body.mMass,
        body.mCenterOfMass,
        body.mInertia);

  Ic.push_back (rbi);
  I.push_back (rbi);
  hc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));
  hdotc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  if (mBodies.size() == fixed_body_discriminator) {
    std::ostringstream errormsg;
    errormsg << "Error: cannot add more than "
             << fixed_body_discriminator
             <<  " movable bodies. You need to modify Model::fixed_body_discriminator for this."
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  previously_added_body_id = mBodies.size() - 1;

  mJointUpdateOrder.clear();

  // update the joint order computation
  std::vector<std::pair<JointType, unsigned int> > joint_types;
  for (unsigned int i = 0; i < mJoints.size(); i++) {
    joint_types.push_back(
      std::pair<JointType, unsigned int> (mJoints[i].mJointType,i));
    mJointUpdateOrder.push_back (mJoints[i].mJointType);
  }

  mJointUpdateOrder.clear();
  JointType current_joint_type = JointTypeUndefined;
  while (joint_types.size() != 0) {
    current_joint_type = joint_types[0].first;

    std::vector<std::pair<JointType, unsigned int> >::iterator type_iter =
      joint_types.begin();

    while (type_iter != joint_types.end()) {
      if (type_iter->first == current_joint_type) {
        mJointUpdateOrder.push_back (type_iter->second);
        type_iter = joint_types.erase (type_iter);
      } else {
        ++type_iter;
      }
    }
  }

  //  for (unsigned int i = 0; i < mJointUpdateOrder.size(); i++) {
  //    std::cout << "i = " << i << ": joint_id = " << mJointUpdateOrder[i]
  // << " joint_type = " << mJoints[mJointUpdateOrder[i]].mJointType << std::endl;
  //  }

  return previously_added_body_id;
}